

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

unsigned_short readushort(FILE *f,int bigendian)

{
  uchar uVar1;
  unsigned_short uVar2;
  undefined8 in_RAX;
  size_t sVar3;
  uchar c2;
  uchar c1;
  
  _c2 = (undefined2)((ulong)in_RAX >> 0x30);
  sVar3 = fread(&c1,1,1,(FILE *)f);
  if ((sVar3 == 0) || (sVar3 = fread(&c2,1,1,(FILE *)f), sVar3 == 0)) {
    fwrite("\nError: fread return a number of element different from the expected.\n",0x46,1,_stderr
          );
    uVar2 = 0;
  }
  else {
    uVar1 = c1;
    if (bigendian != 0) {
      uVar1 = c2;
      c2 = c1;
    }
    uVar2 = CONCAT11(c2,uVar1);
  }
  return uVar2;
}

Assistant:

static unsigned short readushort(FILE * f, int bigendian)
{
    unsigned char c1, c2;
    if (!fread(&c1, 1, 1, f)) {
        fprintf(stderr,
                "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    if (!fread(&c2, 1, 1, f)) {
        fprintf(stderr,
                "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    if (bigendian) {
        return (unsigned short)((c1 << 8) + c2);
    } else {
        return (unsigned short)((c2 << 8) + c1);
    }
}